

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# varint.hpp
# Opt level: O0

uint64_t pstore::varint::decode<unsigned_char*>(uchar *in,uint size)

{
  byte bVar1;
  uint uVar2;
  ulong uStack_28;
  uint shift;
  uint64_t result;
  byte *pbStack_18;
  uint size_local;
  uchar *in_local;
  
  if ((size != 0) && (uVar2 = decode_size<unsigned_char*>(in), size == uVar2)) {
    if (size == 9) {
      in_local = (uchar *)details::decode9<unsigned_char*>(in);
    }
    else {
      uStack_28 = 0;
      bVar1 = 0;
      pbStack_18 = in;
      switch(size) {
      case 8:
        pbStack_18 = in + 1;
        uStack_28 = (ulong)*in;
        bVar1 = 8;
      case 7:
        uStack_28 = (ulong)*pbStack_18 << bVar1 | uStack_28;
        bVar1 = bVar1 + 8;
        pbStack_18 = pbStack_18 + 1;
      case 6:
        uStack_28 = (ulong)*pbStack_18 << bVar1 | uStack_28;
        bVar1 = bVar1 + 8;
        pbStack_18 = pbStack_18 + 1;
      case 5:
        uStack_28 = (ulong)*pbStack_18 << bVar1 | uStack_28;
        bVar1 = bVar1 + 8;
        pbStack_18 = pbStack_18 + 1;
      case 4:
        uStack_28 = (ulong)*pbStack_18 << (bVar1 & 0x3f) | uStack_28;
        bVar1 = bVar1 + 8;
        pbStack_18 = pbStack_18 + 1;
      case 3:
        uStack_28 = (ulong)*pbStack_18 << (bVar1 & 0x3f) | uStack_28;
        bVar1 = bVar1 + 8;
        pbStack_18 = pbStack_18 + 1;
      case 2:
        uStack_28 = (ulong)*pbStack_18 << (bVar1 & 0x3f) | uStack_28;
        bVar1 = bVar1 + 8;
        pbStack_18 = pbStack_18 + 1;
      default:
        in_local = (uchar *)(((ulong)*pbStack_18 << (bVar1 & 0x3f) | uStack_28) >>
                            ((byte)size & 0x3f));
      }
    }
    return (uint64_t)in_local;
  }
  assert_failed("size > 0 && size == decode_size (in)",
                "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/include/pstore/support/varint.hpp"
                ,0x86);
}

Assistant:

std::uint64_t decode (InputIterator in, unsigned size) {
            PSTORE_ASSERT (size > 0 && size == decode_size (in));
            if (size == 9) {
                return details::decode9 (in);
            }

            auto result = std::uint64_t{0};
            auto shift = 0U;
            // clang-format off
            switch (size) {
            // NOLINTNEXTLINE(bugprone-branch-clone)
            case 8: result |= std::uint64_t{*(in++)} << shift; shift += 8; PSTORE_FALLTHROUGH;
            case 7: result |= std::uint64_t{*(in++)} << shift; shift += 8; PSTORE_FALLTHROUGH;
            case 6: result |= std::uint64_t{*(in++)} << shift; shift += 8; PSTORE_FALLTHROUGH;
            case 5: result |= std::uint64_t{*(in++)} << shift; shift += 8; PSTORE_FALLTHROUGH;
            case 4: result |= std::uint64_t{*(in++)} << shift; shift += 8; PSTORE_FALLTHROUGH;
            case 3: result |= std::uint64_t{*(in++)} << shift; shift += 8; PSTORE_FALLTHROUGH;
            case 2: result |= std::uint64_t{*(in++)} << shift; shift += 8; PSTORE_FALLTHROUGH;
            default:
                result |= std::uint64_t{*(in++)} << shift;
            }
            // clang-format on
            return result >> size; // throw away the unwanted size bytes frm the first byte.
        }